

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

bool tinyusdz::tydra::anon_unknown_6::XformOpToProperty(XformOp *x,Property *prop)

{
  PrimVar *pPVar1;
  Property local_8f0;
  undefined4 local_30c;
  undefined1 local_308 [8];
  Attribute attr;
  PrimVar pv;
  Property *prop_local;
  XformOp *x_local;
  
  primvar::PrimVar::PrimVar
            ((PrimVar *)
             &attr._metas.stringData.
              super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Attribute::Attribute((Attribute *)local_308);
  if (x->op_type < ResetXformStack) {
    pPVar1 = XformOp::get_var(x);
    primvar::PrimVar::operator=
              ((PrimVar *)
               &attr._metas.stringData.
                super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,pPVar1);
  }
  else if (x->op_type == ResetXformStack) {
    x_local._7_1_ = false;
    goto LAB_004b034c;
  }
  Attribute::set_var((Attribute *)local_308,
                     (PrimVar *)
                     &attr._metas.stringData.
                      super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Property::Property(&local_8f0,(Attribute *)local_308,false);
  Property::operator=(prop,&local_8f0);
  Property::~Property(&local_8f0);
  x_local._7_1_ = true;
LAB_004b034c:
  local_30c = 1;
  Attribute::~Attribute((Attribute *)local_308);
  primvar::PrimVar::~PrimVar
            ((PrimVar *)
             &attr._metas.stringData.
              super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return x_local._7_1_;
}

Assistant:

bool XformOpToProperty(const XformOp &x, Property &prop) {
  primvar::PrimVar pv;

  Attribute attr;

  switch (x.op_type) {
    case XformOp::OpType::ResetXformStack: {
      // ??? Not exists in Prim's property
      return false;
    }
    case XformOp::OpType::Transform:
    case XformOp::OpType::Scale:
    case XformOp::OpType::Translate:
    case XformOp::OpType::RotateX:
    case XformOp::OpType::RotateY:
    case XformOp::OpType::RotateZ:
    case XformOp::OpType::Orient:
    case XformOp::OpType::RotateXYZ:
    case XformOp::OpType::RotateXZY:
    case XformOp::OpType::RotateYXZ:
    case XformOp::OpType::RotateYZX:
    case XformOp::OpType::RotateZXY:
    case XformOp::OpType::RotateZYX: {
      pv = x.get_var();
    }
  }

  attr.set_var(std::move(pv));
  // TODO: attribute meta

  prop = Property(attr, /* custom */ false);

  return true;
}